

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

AnnotatedHandler * __thiscall
capnp::JsonCodec::loadAnnotatedHandler
          (JsonCodec *this,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_> *table;
  Impl *pIVar1;
  AnnotatedHandler *pAVar2;
  Entry *pEVar3;
  Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&> this_00;
  AnnotatedHandler *pAVar4;
  StructSchema schema_local;
  Fault f;
  Entry local_c0;
  Vector<capnp::Schema> *local_a0;
  ArrayPtr<const_char> local_98;
  Own<capnp::JsonCodec::AnnotatedHandler> local_88;
  Own<capnp::JsonCodec::AnnotatedHandler> local_70;
  Own<capnp::JsonCodec::AnnotatedHandler> newHandler;
  
  pIVar1 = (this->impl).ptr;
  table = &pIVar1->annotatedHandlers;
  local_70.disposer = (Disposer *)0x0;
  local_70.ptr = (AnnotatedHandler *)0x0;
  local_c0.key.baseType = STRUCT;
  local_c0.key.listDepth = '\0';
  local_c0.key.isImplicitParam = false;
  local_c0.key.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  local_c0.key._6_2_ = 0;
  local_c0.value.ptr.disposer = (Disposer *)0x0;
  local_c0.value.ptr.ptr = (AnnotatedHandler *)0x0;
  schema_local = schema;
  local_c0.key.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema.super_Schema.raw;
  local_a0 = dependencies;
  kj::
  Table<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&newHandler,&table->table,
             (long)(pIVar1->annotatedHandlers).table.rows.builder.pos -
             (long)(pIVar1->annotatedHandlers).table.rows.builder.ptr >> 5,&local_c0,0xffffffff);
  pAVar2 = newHandler.ptr;
  pAVar4 = local_c0.value.ptr.ptr;
  if ((char)newHandler.disposer == '\x01') {
    local_c0.value.ptr.ptr = (AnnotatedHandler *)0x0;
    local_88.disposer = local_c0.value.ptr.disposer;
    local_88.ptr = pAVar4;
    if ((table->table).rows.builder.ptr[(long)newHandler.ptr].value.ptr.ptr ==
        (AnnotatedHandler *)0x0) {
      Schema::getProto((Reader *)&newHandler,&schema_local.super_Schema);
      local_98 = (ArrayPtr<const_char>)
                 capnp::schema::Node::Reader::getDisplayName((Reader *)&newHandler);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x591,FAILED,"existing != nullptr",
                 "\"cyclic JSON flattening detected\", schema.getProto().getDisplayName()",
                 (char (*) [32])"cyclic JSON flattening detected",(Reader *)&local_98);
      kj::_::Debug::Fault::fatal(&f);
    }
    kj::Own<capnp::JsonCodec::AnnotatedHandler>::dispose(&local_88);
    pEVar3 = (table->table).rows.builder.ptr + (long)pAVar2;
  }
  else {
    pEVar3 = kj::
             Vector<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry>
             ::
             add<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry>
                       ((Vector<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry>
                         *)table,&local_c0);
  }
  kj::Own<capnp::JsonCodec::AnnotatedHandler>::dispose(&local_c0.value.ptr);
  kj::Own<capnp::JsonCodec::AnnotatedHandler>::dispose(&local_70);
  pAVar4 = (pEVar3->value).ptr.ptr;
  if (pAVar4 == (AnnotatedHandler *)0x0) {
    kj::
    heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
              ((kj *)&newHandler,this,&schema_local,discriminator,unionDeclName,local_a0);
    pAVar4 = newHandler.ptr;
    newHandler.ptr = (AnnotatedHandler *)0x0;
    local_c0.key.field_4.schema = (RawBrandedSchema *)pAVar4;
    this_00 = kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::
              find<capnp::StructSchema&>
                        ((HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>
                          *)&((this->impl).ptr)->annotatedHandlers,&schema_local);
    if (this_00.ptr == (Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x59e,FAILED,"impl->annotatedHandlers.find(schema) != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_98);
    }
    kj::Own<capnp::JsonCodec::AnnotatedHandler>::operator=
              (&(this_00.ptr)->ptr,(Own<capnp::JsonCodec::AnnotatedHandler> *)&local_c0);
    kj::Own<capnp::JsonCodec::AnnotatedHandler>::dispose
              ((Own<capnp::JsonCodec::AnnotatedHandler> *)&local_c0);
    addTypeHandler(this,schema_local,&pAVar4->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>);
    kj::Own<capnp::JsonCodec::AnnotatedHandler>::dispose(&newHandler);
  }
  return pAVar4;
}

Assistant:

JsonCodec::AnnotatedHandler& JsonCodec::loadAnnotatedHandler(
      StructSchema schema, kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
      kj::Maybe<kj::StringPtr> unionDeclName, kj::Vector<Schema>& dependencies) {
  auto& entry = impl->annotatedHandlers.upsert(schema, nullptr,
      [&](kj::Maybe<kj::Own<AnnotatedHandler>>& existing, auto dummy) {
    KJ_ASSERT(existing != nullptr,
        "cyclic JSON flattening detected", schema.getProto().getDisplayName());
  });

  KJ_IF_MAYBE(v, entry.value) {
    // Already exists.
    return **v;
  } else {
    // Not seen before.
    auto newHandler = kj::heap<AnnotatedHandler>(
          *this, schema, discriminator, unionDeclName, dependencies);
    auto& result = *newHandler;

    // Map may have changed, so we have to look up again.
    KJ_ASSERT_NONNULL(impl->annotatedHandlers.find(schema)) = kj::mv(newHandler);

    addTypeHandler(schema, result);
    return result;
  }